

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall protozero::MessageFilter::MessageFilter(MessageFilter *this)

{
  pointer *ppSVar1;
  iterator __position;
  pointer *__ptr;
  
  (this->filter_).message_offset_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_).message_offset_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_).words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_).message_offset_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_).words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_).words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_).suppress_logs_for_fuzzer_ = false;
  (this->tokenizer_).state_ = kFieldPreamble;
  (this->tokenizer_).field_id_ = 0;
  (this->tokenizer_).varint_ = 0;
  *(undefined8 *)((long)&(this->tokenizer_).varint_ + 4) = 0;
  (this->tokenizer_).fixed_int_shift_ = 0;
  (this->tokenizer_).fixed_int_bits_ = 0;
  (this->out_buf_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->out_ = (uint8_t *)0x0;
  *(undefined8 *)((long)&this->out_ + 4) = 0;
  *(undefined8 *)((long)&this->out_end_ + 4) = 0;
  (this->stack_).
  super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tokenizer_).fixed_int_value_ = 0;
  (this->stack_).
  super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->error_ = false;
  this->track_field_usage_ = false;
  (this->field_usage_)._M_h._M_buckets = &(this->field_usage_)._M_h._M_single_bucket;
  (this->field_usage_)._M_h._M_bucket_count = 1;
  (this->field_usage_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->field_usage_)._M_h._M_element_count = 0;
  (this->field_usage_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->field_usage_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->field_usage_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __position._M_current =
       (this->stack_).
       super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    perfetto::std::
    vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
    ::_M_realloc_insert<>(&this->stack_,__position);
  }
  else {
    (__position._M_current)->field_id = 0;
    (__position._M_current)->msg_index = 0;
    (__position._M_current)->size_field = (uint8_t *)0x0;
    (__position._M_current)->in_bytes = 0;
    (__position._M_current)->in_bytes_limit = 0;
    (__position._M_current)->eat_next_bytes = 0;
    (__position._M_current)->out_bytes_written_at_start = 0;
    (__position._M_current)->size_field_len = 0;
    (__position._M_current)->passthrough_eaten_bytes = false;
    *(undefined3 *)&(__position._M_current)->field_0x25 = 0;
    ppSVar1 = &(this->stack_).
               super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

MessageFilter::MessageFilter() {
  // Push a state on the stack for the implicit root message.
  stack_.emplace_back();
}